

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O3

void * __thiscall vector<Edge>::realloc(vector<Edge> *this,void *__ptr,size_t __size)

{
  Edge *pEVar1;
  void *in_RAX;
  ulong *puVar2;
  void *pvVar3;
  void *extraout_RAX;
  long lVar4;
  uint uVar5;
  ulong uVar6;
  
  uVar5 = 1;
  if (1 < (int)(uint)__ptr) {
    uVar5 = (uint)__ptr;
  }
  if (this->_capacity == uVar5) {
    return in_RAX;
  }
  uVar6 = (ulong)uVar5;
  puVar2 = (ulong *)operator_new__(uVar6 * 0xc + 8);
  *puVar2 = uVar6;
  memset((Edge *)(puVar2 + 1),0,((uVar6 * 0xc - 0xc) / 0xc) * 0xc + 0xc);
  pvVar3 = (void *)(long)this->_size;
  pEVar1 = this->vect;
  if ((long)pvVar3 < 1) {
    this->_capacity = uVar5;
    if (pEVar1 == (Edge *)0x0) goto LAB_00102f95;
  }
  else {
    lVar4 = 0;
    do {
      *(undefined8 *)((long)puVar2 + lVar4 + 8) = *(undefined8 *)((long)&pEVar1->_nodeS + lVar4);
      *(undefined4 *)((long)puVar2 + lVar4 + 0x10) = *(undefined4 *)((long)&pEVar1->_cost + lVar4);
      lVar4 = lVar4 + 0xc;
    } while ((long)pvVar3 * 0xc != lVar4);
    this->_capacity = uVar5;
  }
  operator_delete__(&pEVar1[-1]._nodeD);
  pvVar3 = extraout_RAX;
LAB_00102f95:
  this->vect = (Edge *)(puVar2 + 1);
  return pvVar3;
}

Assistant:

inline T max(const T& a, const T& b) {
    return (a < b) ? b : a;
}